

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  FilePath *in_RDI;
  FilePath result;
  FilePath *this;
  string *in_stack_ffffffffffffffa8;
  FilePath *in_stack_ffffffffffffffb0;
  FilePath *in_stack_ffffffffffffffc0;
  FilePath *this_00;
  
  this = in_RDI;
  this_00 = in_RDI;
  FilePath::FilePath(in_stack_ffffffffffffffc0);
  FilePath::FilePath(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  FilePath::Set(this,in_RDI);
  FilePath::~FilePath((FilePath *)0x12378d);
  FilePath::RemoveDirectoryName(this_00);
  FilePath::~FilePath((FilePath *)0x1237a7);
  return this;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(g_executable_path).RemoveExtension("exe"));
#else
  result.Set(FilePath(g_executable_path));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}